

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* adios2::helper::AvailableIpAddresses_abi_cxx11_(void)

{
  if_nameindex *piVar1;
  int __fd;
  int iVar2;
  if_nameindex *__ptr;
  char *pcVar3;
  int *piVar4;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RDI;
  char **ppcVar5;
  string ip;
  ifreq req;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  char local_58 [20];
  in_addr local_44;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  __fd = socket(2,2,0);
  if (-1 < __fd) {
    __ptr = if_nameindex();
    if (__ptr != (if_nameindex *)0x0) {
      pcVar3 = __ptr->if_name;
      if (__ptr->if_index != 0 || pcVar3 != (char *)0x0) {
        ppcVar5 = &__ptr[1].if_name;
        do {
          strncpy(local_58,pcVar3,0xf);
          iVar2 = ioctl(__fd,0x8915,local_58);
          if (iVar2 < 0) {
            piVar4 = __errno_location();
            if (*piVar4 != 99) {
              if_freenameindex(__ptr);
              close(__fd);
              return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_RDI;
            }
          }
          else {
            pcVar3 = inet_ntoa(local_44);
            std::__cxx11::string::string((string *)&local_78,pcVar3,&local_79);
            iVar2 = std::__cxx11::string::compare((char *)&local_78);
            if (iVar2 != 0) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string_const&>(in_RDI,&local_78);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p);
            }
          }
          piVar1 = (if_nameindex *)(ppcVar5 + -1);
          pcVar3 = *ppcVar5;
          ppcVar5 = ppcVar5 + 2;
        } while (pcVar3 != (char *)0x0 || piVar1->if_index != 0);
      }
      if_freenameindex(__ptr);
    }
    close(__fd);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string>
AvailableIpAddresses() noexcept
{
    std::vector<std::string> ips;
    int socket_handler = -1;
    if ((socket_handler = socket(PF_INET, SOCK_DGRAM, 0)) < 0)
    {
        return ips;
    }
    struct if_nameindex *head = if_nameindex();
    if (!head)
    {
        close(socket_handler);
        return ips;
    }
    for (struct if_nameindex *p = head; !(p->if_index == 0 && p->if_name == NULL); ++p)
    {
        struct ifreq req;
        strncpy(req.ifr_name, p->if_name, IFNAMSIZ - 1);
        if (ioctl(socket_handler, SIOCGIFADDR, &req) < 0)
        {
            if (errno == EADDRNOTAVAIL)
            {
                continue;
            }
            if_freenameindex(head);
            close(socket_handler);
            return ips;
        }
        const std::string ip = inet_ntoa(((struct sockaddr_in *)&req.ifr_addr)->sin_addr);
        if (ip != "127.0.0.1")
        {
            ips.emplace_back(ip);
        }
    }
    if_freenameindex(head);
    close(socket_handler);
    return ips;
}